

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_189e5e5::HandleCompareCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  pointer pbVar1;
  pointer pbVar2;
  __type _Var3;
  bool bVar4;
  int iVar5;
  byte extraout_var;
  char *pcVar6;
  string_view value;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string e;
  string e_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  pointer local_78;
  undefined8 local_70;
  undefined8 local_68;
  char *local_60;
  undefined8 local_58;
  string local_50;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x21) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"sub-command COMPARE requires a mode to be specified.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_50.field_2._M_allocated_capacity = local_98.field_2._M_allocated_capacity;
    local_50._M_dataplus._M_p = local_98._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) {
      return false;
    }
  }
  else {
    __rhs = pbVar1 + 1;
    iVar5 = std::__cxx11::string::compare((char *)__rhs);
    if ((((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)__rhs), iVar5 == 0)) ||
        (iVar5 = std::__cxx11::string::compare((char *)__rhs), iVar5 == 0)) ||
       (((iVar5 = std::__cxx11::string::compare((char *)__rhs), iVar5 == 0 ||
         (iVar5 = std::__cxx11::string::compare((char *)__rhs), iVar5 == 0)) ||
        (iVar5 = std::__cxx11::string::compare((char *)__rhs), iVar5 == 0)))) {
      pbVar2 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (0x80 < (ulong)((long)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2)) {
        __lhs = pbVar2 + 2;
        iVar5 = std::__cxx11::string::compare((char *)__rhs);
        if (iVar5 == 0) {
          std::__cxx11::string::compare((string *)__lhs);
          bVar4 = (bool)(extraout_var >> 7);
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)__rhs);
          if (iVar5 == 0) {
            iVar5 = std::__cxx11::string::compare((string *)__lhs);
            bVar4 = iVar5 < 1;
          }
          else {
            iVar5 = std::__cxx11::string::compare((char *)__rhs);
            if (iVar5 == 0) {
              iVar5 = std::__cxx11::string::compare((string *)__lhs);
              bVar4 = 0 < iVar5;
            }
            else {
              iVar5 = std::__cxx11::string::compare((char *)__rhs);
              if (iVar5 == 0) {
                bVar4 = std::operator>=(__lhs,pbVar2 + 3);
              }
              else {
                iVar5 = std::__cxx11::string::compare((char *)__rhs);
                _Var3 = std::operator==(__lhs,pbVar2 + 3);
                bVar4 = _Var3 != (iVar5 != 0);
              }
            }
          }
        }
        if (bVar4 == false) {
          pcVar6 = "0";
        }
        else {
          pcVar6 = "1";
        }
        value._M_str = pcVar6;
        value._M_len = 1;
        cmMakefile::AddDefinition(status->Makefile,pbVar2 + 4,value);
        return true;
      }
      local_98._M_dataplus._M_p = (pointer)0x1a;
      local_98._M_string_length = 0x8d7c42;
      local_98.field_2._M_allocated_capacity = 0;
      local_78 = pbVar1[1]._M_dataplus._M_p;
      local_98.field_2._8_8_ = pbVar1[1]._M_string_length;
      local_70 = 0;
      local_68 = 0x2d;
      local_60 = " needs at least 5 arguments total to command.";
      local_58 = 0;
      views._M_len = 3;
      views._M_array = (iterator)&local_98;
      cmCatViews(&local_50,views);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == &local_50.field_2) {
        return false;
      }
    }
    else {
      std::operator+(&local_98,"sub-command COMPARE does not recognize mode ",__rhs);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      local_50.field_2._M_allocated_capacity = local_98.field_2._M_allocated_capacity;
      local_50._M_dataplus._M_p = local_98._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p == &local_98.field_2) {
        return false;
      }
    }
  }
  operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  return false;
}

Assistant:

bool HandleCompareCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("sub-command COMPARE requires a mode to be specified.");
    return false;
  }
  std::string const& mode = args[1];
  if ((mode == "EQUAL") || (mode == "NOTEQUAL") || (mode == "LESS") ||
      (mode == "LESS_EQUAL") || (mode == "GREATER") ||
      (mode == "GREATER_EQUAL")) {
    if (args.size() < 5) {
      std::string e =
        cmStrCat("sub-command COMPARE, mode ", mode,
                 " needs at least 5 arguments total to command.");
      status.SetError(e);
      return false;
    }

    const std::string& left = args[2];
    const std::string& right = args[3];
    const std::string& outvar = args[4];
    bool result;
    if (mode == "LESS") {
      result = (left < right);
    } else if (mode == "LESS_EQUAL") {
      result = (left <= right);
    } else if (mode == "GREATER") {
      result = (left > right);
    } else if (mode == "GREATER_EQUAL") {
      result = (left >= right);
    } else if (mode == "EQUAL") {
      result = (left == right);
    } else // if(mode == "NOTEQUAL")
    {
      result = !(left == right);
    }
    if (result) {
      status.GetMakefile().AddDefinition(outvar, "1");
    } else {
      status.GetMakefile().AddDefinition(outvar, "0");
    }
    return true;
  }
  std::string e = "sub-command COMPARE does not recognize mode " + mode;
  status.SetError(e);
  return false;
}